

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcAsset::IfcAsset(IfcAsset *this)

{
  *(undefined ***)&this->field_0x160 = &PTR__Object_00816a50;
  *(undefined8 *)&this->field_0x168 = 0;
  *(char **)&this->field_0x170 = "IfcAsset";
  IfcGroup::IfcGroup((IfcGroup *)this,&PTR_construction_vtable_24__00860d18);
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcAsset,_9UL>).aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0;
  *(undefined8 *)this = 0x860c38;
  *(undefined8 *)&this->field_0x160 = 0x860d00;
  *(undefined8 *)&this->field_0x88 = 0x860c60;
  *(undefined8 *)&this->field_0x98 = 0x860c88;
  *(undefined8 *)&this->field_0xd0 = 0x860cb0;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcAsset,_9UL>)._vptr_ObjectHelper =
       (_func_int **)0x860cd8;
  *(undefined1 **)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcAsset,_9UL>).field_0x10 =
       &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcAsset,_9UL>).field_0x20;
  *(undefined8 *)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcAsset,_9UL>).field_0x18 = 0;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcAsset,_9UL>).field_0x20 = 0;
  (this->OriginalValue).obj = (LazyObject *)0x0;
  (this->CurrentValue).obj = (LazyObject *)0x0;
  (this->TotalReplacementCost).obj = (LazyObject *)0x0;
  (this->Owner).
  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->Owner).
  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->User).super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->User).super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->ResponsiblePerson).obj = (LazyObject *)0x0;
  (this->IncorporationDate).obj = (LazyObject *)0x0;
  (this->DepreciatedValue).obj = (LazyObject *)0x0;
  return;
}

Assistant:

IfcAsset() : Object("IfcAsset") {}